

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastq_parser_test.cpp
# Opt level: O1

void __thiscall
bioparser::test::BioparserFastqTest_CompressedParseWhole_Test::
~BioparserFastqTest_CompressedParseWhole_Test(BioparserFastqTest_CompressedParseWhole_Test *this)

{
  Parser<biosoup::Sequence> *pPVar1;
  
  (this->super_BioparserFastqTest).super_Test._vptr_Test =
       (_func_int **)&PTR__BioparserFastqTest_00158130;
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::~vector(&(this->super_BioparserFastqTest).s);
  pPVar1 = (this->super_BioparserFastqTest).p._M_t.
           super___uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_bioparser::Parser<biosoup::Sequence>_*,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           .super__Head_base<0UL,_bioparser::Parser<biosoup::Sequence>_*,_false>._M_head_impl;
  if (pPVar1 != (Parser<biosoup::Sequence> *)0x0) {
    (*pPVar1->_vptr_Parser[1])();
  }
  (this->super_BioparserFastqTest).p._M_t.
  super___uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_bioparser::Parser<biosoup::Sequence>_*,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
  .super__Head_base<0UL,_bioparser::Parser<biosoup::Sequence>_*,_false>._M_head_impl =
       (Parser<biosoup::Sequence> *)0x0;
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserFastqTest, CompressedParseWhole) {
  Setup("sample.fastq.gz");
  s = p->Parse(-1);
  Check();
}